

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,ProcessorInstance *i)

{
  Expression *pEVar1;
  pool_ptr<soul::AST::Expression> local_18;
  
  ASTVisitor::visit(&this->super_ASTVisitor,i);
  local_18.object = (i->arraySize).object;
  checkArraySize(this,&local_18,0x100);
  if ((i->clockMultiplierRatio).object != (Expression *)0x0) {
    pEVar1 = pool_ptr<soul::AST::Expression>::operator*(&i->clockMultiplierRatio);
    validateClockRatio(pEVar1);
  }
  if ((i->clockDividerRatio).object != (Expression *)0x0) {
    pEVar1 = pool_ptr<soul::AST::Expression>::operator*(&i->clockDividerRatio);
    validateClockRatio(pEVar1);
  }
  return;
}

Assistant:

void visit (AST::ProcessorInstance& i) override
        {
            super::visit (i);
            checkArraySize (i.arraySize, AST::maxProcessorArraySize);

            if (i.clockMultiplierRatio != nullptr)   validateClockRatio (*i.clockMultiplierRatio);
            if (i.clockDividerRatio != nullptr)      validateClockRatio (*i.clockDividerRatio);
        }